

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_reporter.h
# Opt level: O0

void __thiscall bandit::detail::info_reporter::context_ended(info_reporter *this,char *desc)

{
  ostream *poVar1;
  char *pcVar2;
  _List_node_base *local_18;
  char *desc_local;
  info_reporter *this_local;
  
  local_18 = (_List_node_base *)desc;
  desc_local = (char *)this;
  progress_reporter::context_ended(&this->super_progress_reporter,desc);
  this->indentation_ = this->indentation_ + -1;
  poVar1 = this->stm_;
  indent_abi_cxx11_((info_reporter *)&stack0xffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,(string *)&stack0xffffffffffffffc8);
  pcVar2 = colorizer::blue(this->colorizer_);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"end ");
  pcVar2 = colorizer::reset(this->colorizer_);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,(char *)local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

virtual void context_ended(const char *desc)
	{
		progress_reporter::context_ended(desc);
		--indentation_;
		stm_
		  << indent()
		  << colorizer_.blue()
		  << "end "
		  << colorizer_.reset()
		  << desc << std::endl;
	}